

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypipe.hpp
# Opt level: O1

bool __thiscall zmq::ypipe_t<zmq::msg_t,_256>::flush(ypipe_t<zmq::msg_t,_256> *this)

{
  msg_t *pmVar1;
  msg_t *pmVar2;
  bool bVar3;
  
  pmVar2 = this->_w;
  if (pmVar2 == this->_f) {
    return true;
  }
  LOCK();
  pmVar1 = (this->_c)._ptr._M_b._M_p;
  bVar3 = pmVar2 == pmVar1;
  if (bVar3) {
    (this->_c)._ptr._M_b._M_p = this->_f;
    pmVar1 = pmVar2;
  }
  UNLOCK();
  if (bVar3) {
    pmVar1 = pmVar2;
  }
  pmVar2 = this->_f;
  bVar3 = pmVar1 == this->_w;
  if (!bVar3) {
    LOCK();
    (this->_c)._ptr._M_b._M_p = pmVar2;
    UNLOCK();
    pmVar2 = this->_f;
  }
  this->_w = pmVar2;
  return bVar3;
}

Assistant:

bool flush ()
    {
        //  If there are no un-flushed items, do nothing.
        if (_w == _f)
            return true;

        //  Try to set 'c' to 'f'.
        if (_c.cas (_w, _f) != _w) {
            //  Compare-and-swap was unseccessful because 'c' is NULL.
            //  This means that the reader is asleep. Therefore we don't
            //  care about thread-safeness and update c in non-atomic
            //  manner. We'll return false to let the caller know
            //  that reader is sleeping.
            _c.set (_f);
            _w = _f;
            return false;
        }

        //  Reader is alive. Nothing special to do now. Just move
        //  the 'first un-flushed item' pointer to 'f'.
        _w = _f;
        return true;
    }